

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  ImDrawChannel *pIVar1;
  ImVector<unsigned_short> *pIVar2;
  int iVar3;
  ImDrawCmd *pIVar4;
  ImDrawCmd *pIVar5;
  unsigned_short *puVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImDrawCmd *pIVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if ((idx < 0) || (this->_Count <= idx)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x60b,"SetCurrentChannel","ImGui ASSERT FAILED: %s","idx >= 0 && idx < _Count");
  }
  if (this->_Current != idx) {
    iVar3 = (draw_list->CmdBuffer).Capacity;
    pIVar5 = (draw_list->CmdBuffer).Data;
    pIVar1 = (this->_Channels).Data + this->_Current;
    (pIVar1->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
    (pIVar1->_CmdBuffer).Capacity = iVar3;
    (pIVar1->_CmdBuffer).Data = pIVar5;
    iVar3 = (draw_list->IdxBuffer).Capacity;
    puVar6 = (draw_list->IdxBuffer).Data;
    pIVar2 = &(this->_Channels).Data[this->_Current]._IdxBuffer;
    pIVar2->Size = (draw_list->IdxBuffer).Size;
    pIVar2->Capacity = iVar3;
    pIVar2->Data = puVar6;
    this->_Current = idx;
    pIVar1 = (this->_Channels).Data + idx;
    iVar3 = (pIVar1->_CmdBuffer).Capacity;
    pIVar5 = (pIVar1->_CmdBuffer).Data;
    (draw_list->CmdBuffer).Size = (pIVar1->_CmdBuffer).Size;
    (draw_list->CmdBuffer).Capacity = iVar3;
    (draw_list->CmdBuffer).Data = pIVar5;
    pIVar2 = &(this->_Channels).Data[idx]._IdxBuffer;
    iVar3 = pIVar2->Capacity;
    puVar6 = pIVar2->Data;
    (draw_list->IdxBuffer).Size = pIVar2->Size;
    (draw_list->IdxBuffer).Capacity = iVar3;
    (draw_list->IdxBuffer).Data = puVar6;
    draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
    pIVar4 = (draw_list->CmdBuffer).Data;
    iVar3 = (draw_list->CmdBuffer).Size;
    pIVar12 = pIVar4 + (long)iVar3 + -1;
    pIVar5 = &draw_list->_CmdHeader;
    if (pIVar4[(long)iVar3 + -1].ElemCount == 0) {
      fVar8 = (pIVar5->ClipRect).x;
      fVar9 = (pIVar5->ClipRect).y;
      fVar10 = (draw_list->_CmdHeader).ClipRect.z;
      fVar11 = (draw_list->_CmdHeader).ClipRect.w;
      uVar7 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
      *(undefined8 *)&pIVar4[(long)iVar3 + -1].ClipRect.w =
           *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
      *(undefined8 *)((long)&pIVar4[(long)iVar3 + -1].TextureId + 4) = uVar7;
      (pIVar12->ClipRect).x = fVar8;
      (pIVar12->ClipRect).y = fVar9;
      pIVar4[(long)iVar3 + -1].ClipRect.z = fVar10;
      pIVar4[(long)iVar3 + -1].ClipRect.w = fVar11;
    }
    else {
      auVar14[0] = -(*(char *)&(pIVar5->ClipRect).x == *(char *)&(pIVar12->ClipRect).x);
      auVar14[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.x + 1));
      auVar14[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.x + 2));
      auVar14[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.x + 3));
      auVar14[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                    *(char *)&pIVar4[(long)iVar3 + -1].ClipRect.y);
      auVar14[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.y + 1));
      auVar14[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.y + 2));
      auVar14[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.y + 3));
      auVar14[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                    *(char *)&pIVar4[(long)iVar3 + -1].ClipRect.z);
      auVar14[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.z + 1));
      auVar14[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                     *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.z + 2));
      auVar14[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                      *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.z + 3));
      auVar14[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                      *(char *)&pIVar4[(long)iVar3 + -1].ClipRect.w);
      auVar14[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                      *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.w + 1));
      auVar14[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                      *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.w + 2));
      auVar14[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                      *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.w + 3));
      auVar13[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar4[(long)iVar3 + -1].ClipRect.w);
      auVar13[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.w + 1));
      auVar13[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.w + 2));
      auVar13[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].ClipRect.w + 3));
      auVar13[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                    *(char *)&pIVar4[(long)iVar3 + -1].TextureId);
      auVar13[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].TextureId + 1));
      auVar13[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].TextureId + 2));
      auVar13[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].TextureId + 3));
      auVar13[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].TextureId + 4));
      auVar13[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                    *(char *)((long)&pIVar4[(long)iVar3 + -1].TextureId + 5));
      auVar13[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                     *(char *)((long)&pIVar4[(long)iVar3 + -1].TextureId + 6));
      auVar13[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                      *(char *)((long)&pIVar4[(long)iVar3 + -1].TextureId + 7));
      auVar13[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset ==
                      (char)pIVar4[(long)iVar3 + -1].VtxOffset);
      auVar13[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                      *(char *)((long)&pIVar4[(long)iVar3 + -1].VtxOffset + 1));
      auVar13[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                      *(char *)((long)&pIVar4[(long)iVar3 + -1].VtxOffset + 2));
      auVar13[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                      *(char *)((long)&pIVar4[(long)iVar3 + -1].VtxOffset + 3));
      auVar13 = auVar13 & auVar14;
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) {
        ImDrawList::AddDrawCmd(draw_list);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;

    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();
}